

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_adapt.c
# Opt level: O3

ARKodeHAdaptMem arkAdaptInit(void)

{
  ARKodeHAdaptMem pAVar1;
  
  pAVar1 = (ARKodeHAdaptMem)calloc(1,0xe0);
  if (pAVar1 != (ARKodeHAdaptMem)0x0) {
    pAVar1->ehist[0] = 1.0;
    pAVar1->ehist[1] = 1.0;
  }
  return pAVar1;
}

Assistant:

ARKodeHAdaptMem arkAdaptInit()
{
  ARKodeHAdaptMem hadapt_mem;

  /* allocate structure */
  hadapt_mem = (ARKodeHAdaptMem) malloc(sizeof(struct ARKodeHAdaptMemRec));
  if (hadapt_mem == NULL)  return(NULL);

  /* initialize values (default parameters are set in arkSetDefaults) */
  memset(hadapt_mem, 0, sizeof(struct ARKodeHAdaptMemRec));
  hadapt_mem->ehist[0] = ONE;
  hadapt_mem->ehist[1] = ONE;
  hadapt_mem->hhist[0] = ZERO;
  hadapt_mem->hhist[1] = ZERO;
  hadapt_mem->nst_acc  = 0;
  hadapt_mem->nst_exp  = 0;
  return(hadapt_mem);
}